

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionValTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,string *field_name,Type *union_type,bool is_array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumDef *dependency;
  EnumDef *union_enum;
  string *psVar2;
  string conversion_function;
  string enum_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_binded_method;
  string union_accessor;
  allocator<char> local_269;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  ImportDefinition local_100;
  
  dependency = union_type->enum_def;
  local_268 = __return_storage_ptr__;
  if (dependency != (EnumDef *)0x0) {
    union_enum = (EnumDef *)union_type;
    AddImport<flatbuffers::EnumDef>(&local_100,this,imports,&dependent->super_Definition,dependency)
    ;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    paVar1 = &local_100.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.name._M_dataplus._M_p == paVar1) {
      local_1a0.field_2._8_8_ = local_100.name.field_2._8_8_;
    }
    else {
      local_1a0._M_dataplus._M_p = local_100.name._M_dataplus._M_p;
    }
    local_1a0._M_string_length = local_100.name._M_string_length;
    local_100.name._M_string_length = 0;
    local_100.name.field_2._M_local_buf[0] = '\0';
    local_100.name._M_dataplus._M_p = (pointer)paVar1;
    anon_unknown_10::ImportDefinition::~ImportDefinition(&local_100);
    std::operator+(&local_100.name,"this.",field_name);
    UnionHasStringType(this,dependency);
    std::operator+(&local_1e0,"this.",field_name);
    std::operator+(&local_160,&local_1e0,".bind(this)");
    std::__cxx11::string::~string((string *)&local_1e0);
    (local_268->_M_dataplus)._M_p = (pointer)&local_268->field_2;
    local_268->_M_string_length = 0;
    (local_268->field_2)._M_local_buf[0] = '\0';
    if (is_array) {
      GenUnionListConvFuncName_abi_cxx11_(&local_1e0,this,dependency);
      std::__cxx11::string::assign((char *)local_268);
      GenObjApiUnionTypeTS
                (&local_220,this,imports,union_type->struct_def,(IDLOptions *)union_type->enum_def,
                 union_enum);
      psVar2 = local_268;
      std::operator+(&local_260,"    const ret: (",&local_220);
      std::operator+(&local_240,&local_260,")[] = [];\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"TypeLength",(allocator<char> *)&local_180);
      Namer::Method(&local_200,&(this->namer_).super_Namer,field_name,&local_1c0);
      std::operator+(&local_220,"    for(let targetEnumIndex = 0; targetEnumIndex < this.",
                     &local_200);
      std::operator+(&local_260,&local_220,"()");
      std::operator+(&local_240,&local_260,"; ++targetEnumIndex) {\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"Type",(allocator<char> *)&local_1c0);
      Namer::Method(&local_220,&(this->namer_).super_Namer,field_name,&local_200);
      std::operator+(&local_260,"      const targetEnum = this.",&local_220);
      std::operator+(&local_240,&local_260,"(targetEnumIndex);\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::operator+(&local_260,"      if(targetEnum === null || ",&local_1a0);
      std::operator+(&local_240,&local_260,"[targetEnum!] === \'NONE\') { continue; }\n\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::operator+(&local_200,"      const temp = ",&local_1e0);
      std::operator+(&local_220,&local_200,"(targetEnum, ");
      std::operator+(&local_260,&local_220,&local_160);
      std::operator+(&local_240,&local_260,", targetEnumIndex);\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    else {
      GenUnionConvFuncName_abi_cxx11_(&local_1e0,this,dependency);
      psVar2 = local_268;
      std::__cxx11::string::assign((char *)local_268);
      std::operator+(&local_180,"      const temp = ",&local_1e0);
      std::operator+(&local_1c0,&local_180,"(this.");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Type",&local_269);
      Namer::Method(&local_120,&(this->namer_).super_Namer,field_name,&local_140);
      std::operator+(&local_200,&local_1c0,&local_120);
      std::operator+(&local_220,&local_200,"(), ");
      std::operator+(&local_260,&local_220,&local_160);
      std::operator+(&local_240,&local_260,");\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_1a0);
    return psVar2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                ,0x454,
                "std::string flatbuffers::ts::TsGenerator::GenUnionValTS(import_set &, const StructDef &, const std::string &, const Type &, const bool)"
               );
}

Assistant:

std::string GenUnionValTS(import_set &imports, const StructDef &dependent,
                            const std::string &field_name,
                            const Type &union_type,
                            const bool is_array = false) {
    if (union_type.enum_def) {
      const auto &enum_def = *union_type.enum_def;
      const auto enum_type = AddImport(imports, dependent, enum_def).name;
      const std::string union_accessor = "this." + field_name;

      const auto union_has_string = UnionHasStringType(enum_def);
      const auto field_binded_method = "this." + field_name + ".bind(this)";

      std::string ret;

      if (!is_array) {
        const auto conversion_function = GenUnionConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "      const temp = " + conversion_function + "(this." +
               namer_.Method(field_name, "Type") + "(), " +
               field_binded_method + ");\n";
        ret += "      if(temp === null) { return null; }\n";
        ret += union_has_string
                   ? "      if(typeof temp === 'string') { return temp; }\n"
                   : "";
        ret += "      return temp.unpack()\n";
        ret += "  })()";
      } else {
        const auto conversion_function = GenUnionListConvFuncName(enum_def);

        ret = "(() => {\n";
        ret += "    const ret: (" +
               GenObjApiUnionTypeTS(imports, *union_type.struct_def,
                                    parser_.opts, *union_type.enum_def) +
               ")[] = [];\n";
        ret += "    for(let targetEnumIndex = 0; targetEnumIndex < this." +
               namer_.Method(field_name, "TypeLength") + "()" +
               "; "
               "++targetEnumIndex) {\n";
        ret += "      const targetEnum = this." +
               namer_.Method(field_name, "Type") + "(targetEnumIndex);\n";
        ret += "      if(targetEnum === null || " + enum_type +
               "[targetEnum!] === 'NONE') { "
               "continue; }\n\n";
        ret += "      const temp = " + conversion_function + "(targetEnum, " +
               field_binded_method + ", targetEnumIndex);\n";
        ret += "      if(temp === null) { continue; }\n";
        ret += union_has_string ? "      if(typeof temp === 'string') { "
                                  "ret.push(temp); continue; }\n"
                                : "";
        ret += "      ret.push(temp.unpack());\n";
        ret += "    }\n";
        ret += "    return ret;\n";
        ret += "  })()";
      }

      return ret;
    }

    FLATBUFFERS_ASSERT(0);
    return "";
  }